

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O0

Var create_const_vector(Context *ctx,ConstVector *consts)

{
  Var pvVar1;
  Var pvVar2;
  const_reference pvVar3;
  Const *const_;
  char buf [32];
  Var constDescriptor;
  size_t i;
  Var constsArr;
  ConstVector *consts_local;
  Context *ctx_local;
  
  pvVar1 = (*ctx->chakra->spec->createArray)(ctx->chakra->user_data);
  for (constDescriptor = (Var)0x0;
      pvVar2 = (Var)std::vector<wabt::Const,_std::allocator<wabt::Const>_>::size(consts),
      constDescriptor < pvVar2; constDescriptor = (Var)((long)constDescriptor + 1)) {
    pvVar2 = (*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
    (*ctx->chakra->spec->push)(pvVar1,pvVar2,ctx->chakra->user_data);
    pvVar3 = std::vector<wabt::Const,_std::allocator<wabt::Const>_>::at
                       (consts,(size_type)constDescriptor);
    switch(pvVar3->type) {
    case F64:
      write_string(ctx,pvVar2,0xb,"f64",0xffffffff);
      snprintf((char *)&const_,0x20,"%llu",(pvVar3->field_2).u64);
      break;
    case F32:
      write_string(ctx,pvVar2,0xb,"f32",0xffffffff);
      snprintf((char *)&const_,0x20,"%u",(ulong)(pvVar3->field_2).u32);
      break;
    case I64:
      write_string(ctx,pvVar2,0xb,"i64",0xffffffff);
      snprintf((char *)&const_,0x20,"%llu",(pvVar3->field_2).u64);
      break;
    case I32:
      write_string(ctx,pvVar2,0xb,"i32",0xffffffff);
      snprintf((char *)&const_,0x20,"%u",(ulong)(pvVar3->field_2).u32);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                    ,200,"Js::Var create_const_vector(Context *, const ConstVector &)");
    }
    write_string(ctx,pvVar2,0xc,(char *)&const_,0xffffffff);
  }
  return pvVar1;
}

Assistant:

Js::Var create_const_vector(Context* ctx, const ConstVector& consts)
{
    Js::Var constsArr = ctx->chakra->spec->createArray(ctx->chakra->user_data);

    size_t i;
    for (i = 0; i < consts.size(); ++i)
    {
        Js::Var constDescriptor = ctx->chakra->spec->createObject(ctx->chakra->user_data);
        ctx->chakra->spec->push(constsArr, constDescriptor, ctx->chakra->user_data);

        char buf[32];
        const Const& const_ = consts.at(i);
        switch (const_.type)
        {
        case Type::I32:
            write_string(ctx, constDescriptor, PropertyIds::type, "i32");
            wabt_snprintf(buf, 32, "%u", const_.u32);
            break;
        case Type::I64:
            write_string(ctx, constDescriptor, PropertyIds::type, "i64");
            wabt_snprintf(buf, 32, "%llu", const_.u64);
            break;
        case Type::F32:
            write_string(ctx, constDescriptor, PropertyIds::type, "f32");
            wabt_snprintf(buf, 32, "%u", const_.f32_bits);
            break;
        case Type::F64:
            write_string(ctx, constDescriptor, PropertyIds::type, "f64");
            wabt_snprintf(buf, 32, "%llu", const_.f64_bits);
            break;
        default:
            assert(0);
            throw WabtAPIError("invalid constant type");
        }
        write_string(ctx, constDescriptor, PropertyIds::value, buf);
    }
    return constsArr;
}